

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Parse *pPVar5;
  int in_ECX;
  Parse *pParse_00;
  undefined4 in_EDX;
  Parse *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int destIfNull;
  int isTrue;
  int isNot;
  int d2;
  Expr *pAlt;
  int r2;
  int r1;
  int op;
  Vdbe *v;
  int regFree2;
  int regFree1;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Parse *in_stack_ffffffffffffffb8;
  int dest_00;
  Vdbe *pVVar6;
  int iReg;
  int iReg_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar6 = in_RDI->pVdbe;
  iReg_00 = 0;
  iReg = 0;
  if ((pVVar6 == (Vdbe *)0x0) || (in_RSI == (Parse *)0x0)) goto LAB_001ceac1;
  pParse_00 = (Parse *)(ulong)(*(byte *)&in_RSI->db - 0x13);
  switch(pParse_00) {
  case (Parse *)0x0:
    sqlite3ExprIfTrue((Parse *)0x0,(Expr *)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    break;
  default:
    goto LAB_001cea2a;
  case (Parse *)0x18:
  case (Parse *)0x19:
    pPVar5 = (Parse *)sqlite3ExprSimplifiedAndOr((Expr *)pParse_00);
    iVar4 = (int)((ulong)pVVar6 >> 0x20);
    if (pPVar5 == in_RSI) {
      if (*(char *)&in_RSI->db == ',') {
        sqlite3ExprIfFalse(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),iVar4,(int)pVVar6);
        sqlite3ExprIfFalse(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pVVar6 >> 0x20),
                           (int)pVVar6);
      }
      else {
        sqlite3VdbeMakeLabel(in_RDI);
        sqlite3ExprIfTrue((Parse *)CONCAT44(iReg_00,iReg),(Expr *)in_RDI,
                          (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
        sqlite3ExprIfFalse(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pVVar6 >> 0x20),
                           (int)pVVar6);
        sqlite3VdbeResolveLabel((Vdbe *)pParse_00,in_stack_ffffffffffffff9c);
      }
    }
    else {
      sqlite3ExprIfFalse(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),iVar4,(int)pVVar6);
    }
    break;
  case (Parse *)0x1a:
  case (Parse *)0x1b:
    in_ECX = 0x80;
  case (Parse *)0x22:
  case (Parse *)0x23:
  case (Parse *)0x24:
  case (Parse *)0x25:
  case (Parse *)0x26:
  case (Parse *)0x27:
    iVar4 = sqlite3ExprIsVector((Expr *)0x1ce8ca);
    dest_00 = (int)pVVar6;
    if (iVar4 == 0) {
      sqlite3ExprCodeTemp(pParse_00,
                          (Expr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      iVar4 = (int)in_RSI;
      sqlite3ExprCodeTemp(pParse_00,
                          (Expr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      codeCompare(in_stack_ffffffffffffffb8,
                  (Expr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                  (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,in_stack_ffffffffffffff9c,dest_00,
                  in_ECX,iVar4);
    }
    else {
LAB_001cea2a:
      if (((ulong)in_RSI->db & 0x2000000100000000) == 0x2000000000000000) {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c);
      }
      else if (((ulong)in_RSI->db & 0x1000000100000000) != 0x1000000000000000) {
        sqlite3ExprCodeTemp(pParse_00,
                            (Expr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,in_stack_ffffffffffffff9c,
                          in_stack_ffffffffffffff98);
      }
    }
    break;
  case (Parse *)0x1e:
    exprCodeBetween(in_stack_ffffffffffffffb8,
                    (Expr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac,(_func_void_Parse_ptr_Expr_ptr_int_int *)pParse_00,
                    in_stack_ffffffffffffff9c);
    break;
  case (Parse *)0x1f:
    if (in_ECX == 0) {
      sqlite3VdbeMakeLabel(in_RDI);
      sqlite3ExprCodeIN(_regFree2,(Expr *)pParse,pExpr._4_4_,(int)pExpr);
      sqlite3VdbeResolveLabel((Vdbe *)pParse_00,in_stack_ffffffffffffff9c);
    }
    else {
      sqlite3ExprCodeIN(_regFree2,(Expr *)pParse,pExpr._4_4_,(int)pExpr);
    }
    break;
  case (Parse *)0x20:
  case (Parse *)0x21:
    sqlite3ExprCodeTemp(pParse_00,
                        (Expr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    sqlite3VdbeTypeofColumn
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
    break;
  case (Parse *)0x9c:
    uVar2 = (uint)(*(char *)((long)&in_RSI->db + 2) == '.');
    uVar3 = sqlite3ExprTruthValue((Expr *)0x1ce82c);
    if (uVar3 == uVar2) {
      sqlite3ExprIfTrue((Parse *)CONCAT44(iReg_00,iReg),(Expr *)in_RDI,(int)((ulong)in_RSI >> 0x20),
                        (int)in_RSI);
    }
    else {
      sqlite3ExprIfFalse(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),(int)((ulong)pVVar6 >> 0x20),
                         (int)pVVar6);
    }
  }
  sqlite3ReleaseTempReg(in_RDI,iReg_00);
  sqlite3ReleaseTempReg(in_RDI,iReg);
LAB_001ceac1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;
  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND:
    case TK_OR: {
      Expr *pAlt = sqlite3ExprSimplifiedAndOr(pExpr);
      if( pAlt!=pExpr ){
        sqlite3ExprIfFalse(pParse, pAlt, dest, jumpIfNull);
      }else if( pExpr->op==TK_AND ){
        testcase( jumpIfNull==0 );
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
        sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      }else{
        int d2 = sqlite3VdbeMakeLabel(pParse);
        testcase( jumpIfNull==0 );
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2,
                          jumpIfNull^SQLITE_JUMPIFNULL);
        sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
        sqlite3VdbeResolveLabel(v, d2);
      }
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;   /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;  /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        /* IS TRUE and IS NOT FALSE */
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? 0 : SQLITE_JUMPIFNULL);

      }else{
        /* IS FALSE and IS NOT TRUE */
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? 0 : SQLITE_JUMPIFNULL);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      jumpIfNull = SQLITE_NULLEQ;
      /* no break */ deliberate_fall_through
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull,ExprHasProperty(pExpr,EP_Commuted));
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeTypeofColumn(v, r1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( op==TK_ISNULL );   VdbeCoverageIf(v, op==TK_ISNULL);
      testcase( op==TK_NOTNULL );  VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfFalse, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(pParse);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
    default_expr:
      if( ExprAlwaysFalse(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( ExprAlwaysTrue(pExpr) ){
        /* no-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}